

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

void Saig_StrSimSetFinalMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  void **ppvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Man_t *pAVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  int level;
  Aig_Man_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  uint uVar12;
  uint uVar13;
  
  pAVar9 = p0;
  Aig_ManIncrementTravId(p0);
  pAVar4 = (Aig_Man_t *)(long)p0->vObjs->nSize;
  if ((long)pAVar4 < 1) {
    iVar7 = 0;
    iVar6 = 0;
  }
  else {
    ppvVar1 = p0->vObjs->pArray;
    pAVar9 = (Aig_Man_t *)0x0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)ppvVar1[(long)pAVar9];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        ppAVar3 = p0->pReprs;
        if (ppAVar3 == (Aig_Obj_t **)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = ppAVar3[pAVar2->Id];
        }
        if (pAVar10 != (Aig_Obj_t *)0x0) {
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = p1->pReprs[pAVar10->Id];
          }
          if (pAVar2 != pAVar11) {
            __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x248,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
          }
          iVar7 = iVar7 + 1;
          uVar13 = (uint)*(undefined8 *)&pAVar2->field_0x18;
          if ((uVar13 & 7) - 7 < 0xfffffffe) {
            if (((uVar13 & 7) == 2) && (p0->nTruePis <= (pAVar2->field_0).CioId)) {
              if ((((uint)*(undefined8 *)&pAVar10->field_0x18 & 7) != 2) ||
                 ((pAVar10->field_0).CioId < p1->nTruePis)) {
                __assert_fail("Saig_ObjIsLo(p1, pObj1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                              ,0x259,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
              }
              if ((pAVar2->field_0).CioId < p0->nTruePis) {
LAB_006ecb30:
                __assert_fail("Saig_ObjIsLo(p, pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                              ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
              }
              uVar13 = ((pAVar2->field_0).CioId - p0->nTruePis) + p0->nTruePos;
              if (((int)uVar13 < 0) || (p0->vCos->nSize <= (int)uVar13)) {
LAB_006ecb11:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              if ((pAVar10->field_0).CioId < p1->nTruePis) goto LAB_006ecb30;
              uVar12 = ((pAVar10->field_0).CioId - p1->nTruePis) + p1->nTruePos;
              if (((int)uVar12 < 0) || (p1->vCos->nSize <= (int)uVar12)) goto LAB_006ecb11;
              if (ppAVar3 == (Aig_Obj_t **)0x0) {
                pAVar11 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar11 = ppAVar3[*(int *)((*(ulong *)((long)p0->vCos->pArray[uVar13] + 8) &
                                           0xfffffffffffffffe) + 0x24)];
              }
              pAVar10 = *(Aig_Obj_t **)((long)p1->vCos->pArray[uVar12] + 8);
LAB_006ec99c:
              if (pAVar11 != (Aig_Obj_t *)((ulong)pAVar10 & 0xfffffffffffffffe)) goto LAB_006ec9a5;
            }
          }
          else {
            if ((*(uint *)&pAVar10->field_0x18 & 7) - 7 < 0xfffffffe) {
              __assert_fail("Aig_ObjIsNode(pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                            ,0x24b,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
            }
            if (ppAVar3 == (Aig_Obj_t **)0x0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar11 = ppAVar3[*(int *)(((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe) + 0x24)];
            }
            if (pAVar11 == (Aig_Obj_t *)((ulong)pAVar10->pFanin0 & 0xfffffffffffffffe)) {
              if (ppAVar3 == (Aig_Obj_t **)0x0) {
                pAVar11 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar11 = ppAVar3[*(int *)(((ulong)pAVar2->pFanin1 & 0xfffffffffffffffe) + 0x24)];
              }
              pAVar10 = pAVar10->pFanin1;
              goto LAB_006ec99c;
            }
LAB_006ec9a5:
            pAVar2->TravId = p0->nTravIds;
            iVar6 = iVar6 + 1;
          }
        }
      }
      pAVar9 = (Aig_Man_t *)((long)&pAVar9->pName + 1);
    } while (pAVar4 != pAVar9);
  }
  level = (int)pAVar9;
  pVVar8 = p0->vObjs;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar8->pArray[lVar5];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        ppAVar3 = p0->pReprs;
        if (ppAVar3 == (Aig_Obj_t **)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = ppAVar3[pAVar2->Id];
        }
        if (pAVar10 != (Aig_Obj_t *)0x0) {
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = p1->pReprs[pAVar10->Id];
          }
          if (pAVar2 != pAVar11) {
            __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x269,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
          }
          if (pAVar2->TravId == p0->nTravIds) {
            if (ppAVar3 == (Aig_Obj_t **)0x0) {
LAB_006eca95:
              __assert_fail("p->pReprs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
            }
            ppAVar3[pAVar2->Id] = (Aig_Obj_t *)0x0;
            if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_006eca95;
            p1->pReprs[pAVar10->Id] = (Aig_Obj_t *)0x0;
          }
        }
      }
      lVar5 = lVar5 + 1;
      pVVar8 = p0->vObjs;
      level = pVVar8->nSize;
    } while (lVar5 < level);
  }
  Abc_Print(level,"Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
            ((double)iVar6 * 100.0) / (double)iVar7);
  return;
}

Assistant:

void Saig_StrSimSetFinalMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    Aig_Obj_t * pFanin00, * pFanin01;
    Aig_Obj_t * pFanin10, * pFanin11;
    int i, CountAll = 0, CountNot = 0;
    Aig_ManIncrementTravId( p0 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        CountAll++;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsNode(pObj0) )
        {
            assert( Aig_ObjIsNode(pObj1) );
            pFanin00 = Aig_ObjFanin0(pObj0);
            pFanin01 = Aig_ObjFanin1(pObj0);
            pFanin10 = Aig_ObjFanin0(pObj1);
            pFanin11 = Aig_ObjFanin1(pObj1);
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 ||
                 Aig_ObjRepr(p0, pFanin01) != pFanin11 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
        else if ( Saig_ObjIsLo(p0, pObj0) )
        {
            assert( Saig_ObjIsLo(p1, pObj1) );
            pFanin00 = Aig_ObjFanin0( Saig_ObjLoToLi(p0, pObj0) );
            pFanin10 = Aig_ObjFanin0( Saig_ObjLoToLi(p1, pObj1) );
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
    }
    // remove irrelevant matches
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsTravIdCurrent( p0, pObj0 ) )
        {
            Aig_ObjSetRepr( p0, pObj0, NULL );
            Aig_ObjSetRepr( p1, pObj1, NULL );
        }
    }
    Abc_Print( 1, "Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
        CountAll, CountNot, 100.0*CountNot/CountAll );
}